

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O2

void __thiscall pg::TLQSolver::solve(TLQSolver *this,bitset *SG,int vtop,int pe,int po)

{
  bitset *pbVar1;
  bitset *this_00;
  bitset *R_00;
  pointer *pppbVar2;
  bitset *pbVar3;
  uint uVar4;
  int *piVar5;
  uint *puVar6;
  bitset *this_01;
  pointer ppbVar7;
  bitset *this_02;
  uint64_t *puVar8;
  uint *puVar9;
  bitset *this_03;
  bool bVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  size_t sVar17;
  pointer piVar18;
  ostream *poVar19;
  bitset *this_04;
  ulong uVar20;
  ulong uVar21;
  int *piVar22;
  pointer ppbVar23;
  long lVar24;
  long lVar25;
  int v_4;
  uint uVar26;
  ulong uVar27;
  bitset *this_05;
  bitset *this_06;
  int v;
  int v_7;
  ulong local_150;
  bitset R;
  bitset SG_1;
  bitset H;
  bitset local_50;
  
  local_150 = (ulong)(uint)vtop;
  this->iterations = this->iterations + 1;
  if (po < 1) {
    bitset::operator|=(&this->W0,SG);
    if ((this->super_Solver).trace < 2) {
      return;
    }
    bVar10 = bitset::any(SG);
    if (!bVar10) {
      return;
    }
    std::operator<<((this->super_Solver).logger,"presumed won by player 0:");
    while (iVar12 = (int)local_150, -1 < iVar12) {
      if ((SG->_bits[local_150 >> 6] >> (local_150 & 0x3f) & 1) != 0) {
        poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
        H._bits = (uint64_t *)(this->super_Solver).game;
        H._size._0_4_ = iVar12;
        poVar19 = operator<<(poVar19,(_label_vertex *)&H);
        std::operator<<(poVar19,"\x1b[m");
      }
      local_150 = (ulong)(iVar12 - 1);
    }
  }
  else {
    uVar21 = (ulong)(uint)pe;
    if (0 < pe) {
      uVar27 = (ulong)vtop;
      uVar20 = (ulong)(uint)po;
      if (((SG->_bits[uVar27 >> 6] >> (uVar27 & 0x3f) & 1) == 0) &&
         (local_150 = bitset::find_prev(SG,uVar27), (int)local_150 == -1)) {
        return;
      }
      piVar18 = (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar27 = (ulong)(int)local_150;
      if ((ulong)((long)piVar18 -
                  (long)(this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <
          (ulong)((long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3)) {
        H._bits = (uint64_t *)CONCAT44(H._bits._4_4_,((this->super_Solver).game)->_priority[uVar27])
        ;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Ps,(int *)&H);
        sVar17 = bitset::count(SG);
        do {
          po = (int)uVar20;
          uVar20 = uVar20 >> 1;
        } while (sVar17 < uVar20);
        do {
          pe = (int)uVar21;
          uVar21 = uVar21 >> 1;
        } while (sVar17 < uVar21);
        piVar18 = (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar26 = piVar18[-1];
      if ((uVar26 & 1) == 0) {
        uVar11 = pe;
        uVar13 = (uint)po >> 1;
      }
      else {
        uVar11 = (uint)pe >> 1;
        uVar13 = po;
      }
      solve(this,SG,(int)local_150,uVar11,uVar13);
      uVar11 = uVar26 & 1;
      if (1 < (this->super_Solver).trace) {
        poVar19 = std::operator<<((this->super_Solver).logger,"in pr=");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar26);
        poVar19 = std::operator<<(poVar19,", pe=");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,pe);
        poVar19 = std::operator<<(poVar19,", po=");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,po);
        std::endl<char,std::char_traits<char>>(poVar19);
      }
      pbVar1 = &this->W1;
      pbVar3 = &this->W0;
      this_04 = pbVar1;
      if (uVar11 == 0) {
        this_04 = pbVar3;
      }
      this_05 = pbVar3;
      if (uVar11 == 0) {
        this_05 = pbVar1;
      }
      if (((SG->_bits[uVar27 >> 6] >> (local_150 & 0x3f) & 1) == 0) &&
         (local_150 = bitset::find_prev(SG,uVar27), (int)local_150 == -1)) {
        return;
      }
      bitset::bitset(&H,((this->super_Solver).game)->n_vertices);
      R._bits = (uint64_t *)&H;
      std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
                ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Hs,(bitset **)&R);
      uVar20 = (ulong)(uVar11 << 5);
      uVar21 = local_150;
      while( true ) {
        iVar12 = (int)uVar21;
        R._bits._0_4_ = iVar12;
        if (iVar12 == -1) break;
        uVar27 = (ulong)(long)iVar12 >> 6;
        if (((SG->_bits[uVar27] >> (uVar21 & 0x3f) & 1) != 0) &&
           ((H._bits[uVar27] & 1L << (uVar21 & 0x3f)) == 0)) {
          if ((((this->super_Solver).game)->_priority[iVar12] & 1U) != uVar11) break;
          std::vector<int,_std::allocator<int>_>::push_back(&this->heads,(value_type_conflict3 *)&R)
          ;
          uVar21 = (ulong)(int)(uint)R._bits;
          H._bits[uVar21 >> 6] = H._bits[uVar21 >> 6] | 1L << (uVar21 & 0x3f);
          this->str[uVar21] = -1;
          iVar12 = (this->Q).pointer;
          (this->Q).pointer = iVar12 + 1;
          (this->Q).queue[iVar12] = (uint)R._bits;
          while( true ) {
            iVar12 = (this->Q).pointer;
            if ((long)iVar12 == 0) break;
            (this->Q).pointer = iVar12 + -1;
            uVar4 = (this->Q).queue[(long)iVar12 + -1];
            attractVertices(this,uVar11,uVar4,&H,SG,SG);
            attractTangles(this,uVar11,uVar4,SG,&H,SG);
          }
          iVar12 = (uint)R._bits;
        }
        uVar21 = (ulong)(iVar12 - 1);
      }
      if ((this->super_Solver).trace != 0) {
        poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mregion \x1b[36m");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar26);
        std::operator<<(poVar19,"\x1b[m");
        sVar17 = bitset::find_last(&H);
        for (; poVar19 = (this->super_Solver).logger, sVar17 != 0xffffffffffffffff;
            sVar17 = bitset::find_prev(&H,sVar17)) {
          poVar19 = std::operator<<(poVar19," \x1b[38;5;38m");
          R._size._0_4_ = (int)sVar17;
          R._bits = (uint64_t *)(this->super_Solver).game;
          poVar19 = operator<<(poVar19,(_label_vertex *)&R);
          std::operator<<(poVar19,"\x1b[m");
          if ((1 < (this->super_Solver).trace) &&
             (uVar13 = Solver::owner(&this->super_Solver,(int)sVar17), uVar13 == uVar11)) {
            poVar19 = (this->super_Solver).logger;
            if (this->str[sVar17] == -1) {
              std::operator<<(poVar19,"\x1b[38;5;37m\x1b[33m=>\x1b[38;5;37m-\x1b[m");
            }
            else {
              poVar19 = std::operator<<(poVar19,"\x1b[33m=>\x1b[38;5;37m =>");
              R._size._0_4_ = this->str[sVar17];
              R._bits = (uint64_t *)(this->super_Solver).game;
              poVar19 = operator<<(poVar19,(_label_vertex *)&R);
              std::operator<<(poVar19,"\x1b[m");
            }
          }
        }
        std::endl<char,std::char_traits<char>>(poVar19);
      }
      piVar22 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar5 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      while (piVar22 != piVar5) {
        bVar10 = attracts(this,uVar11,*piVar22,&H,SG);
        piVar22 = piVar22 + 1;
        if (!bVar10) goto LAB_00167a53;
      }
      puVar6 = this->pea_vidx;
      lVar25 = ((this->super_Solver).game)->n_vertices;
      for (lVar24 = 0; lVar25 << 2 != lVar24; lVar24 = lVar24 + 4) {
        *(undefined4 *)((long)puVar6 + lVar24) = 0;
      }
      this->pea_curidx = 1;
      this_00 = &this->S;
      R_00 = &this->G;
      piVar5 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar22 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start; piVar22 != piVar5; piVar22 = piVar22 + 1) {
        uVar13 = this->dominions;
        uVar15 = this->tangles;
        extractTangles(this,*piVar22,&H);
        uVar14 = uVar13;
        if (uVar13 != this->dominions) {
          for (sVar17 = bitset::find_last(this_00); sVar17 != 0xffffffffffffffff;
              sVar17 = bitset::find_prev(this_00,sVar17)) {
            iVar12 = (this->Q).pointer;
            (this->Q).pointer = iVar12 + 1;
            (this->Q).queue[iVar12] = (uint)sVar17;
          }
          while( true ) {
            iVar12 = (this->Q).pointer;
            if ((long)iVar12 == 0) break;
            (this->Q).pointer = iVar12 + -1;
            uVar4 = (this->Q).queue[(long)iVar12 + -1];
            attractVertices(this,uVar11,uVar4,this_00,R_00,R_00);
            attractTangles(this,uVar11,uVar4,R_00,this_00,R_00);
          }
          bitset::operator|=(this_04,this_00);
          bitset::operator-=(this_05,this_00);
          bitset::operator-=(R_00,this_00);
          sVar17 = (this->S)._bitssize;
          puVar8 = (this->S)._bits;
          for (lVar25 = 0; sVar17 << 3 != lVar25; lVar25 = lVar25 + 8) {
            *(undefined8 *)((long)puVar8 + lVar25) = 0;
          }
          uVar14 = this->dominions;
        }
        if ((uVar13 != uVar14) || (uVar15 != this->tangles)) {
          uVar13 = 0;
          while( true ) {
            ppbVar23 = (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            uVar21 = (ulong)uVar13;
            if ((ulong)((long)(this->Rs).
                              super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppbVar23 >> 3) <=
                uVar21) break;
            this_01 = ppbVar23[uVar21];
            uVar15 = (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21];
            ppbVar7 = (this->Hs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            this_02 = ppbVar7[uVar21];
            R = (bitset)ZEXT1632(ZEXT816(0) << 0x40);
            if (uVar21 == 0) {
              bitset::operator&=(this_01,R_00);
              operator-(&SG_1,R_00,this_01);
              bitset::operator=(&R,&SG_1);
              bitset::~bitset(&SG_1);
            }
            else {
              operator-(&SG_1,ppbVar23[uVar13 - 1],ppbVar7[uVar13 - 1]);
              bitset::operator&=(this_01,&SG_1);
              operator-(&local_50,&SG_1,this_01);
              bitset::operator=(&R,&local_50);
              bitset::~bitset(&local_50);
              bitset::~bitset(&SG_1);
            }
            uVar15 = uVar15 & 1;
            for (sVar17 = bitset::find_last(&R); sVar17 != 0xffffffffffffffff;
                sVar17 = bitset::find_prev(&R,sVar17)) {
              iVar12 = (this->Q).pointer;
              (this->Q).pointer = iVar12 + 1;
              (this->Q).queue[iVar12] = (uint)sVar17;
            }
            while( true ) {
              iVar12 = (this->Q).pointer;
              if ((long)iVar12 == 0) break;
              (this->Q).pointer = iVar12 + -1;
              uVar4 = (this->Q).queue[(long)iVar12 + -1];
              attractVertices(this,uVar15 ^ 1,uVar4,&R,this_01,this_01);
              attractTangles(this,uVar15 ^ 1,uVar4,this_01,&R,this_01);
            }
            bitset::operator-=(this_01,&R);
            this_06 = pbVar1;
            this_03 = pbVar3;
            if (uVar15 == 0) {
              this_06 = pbVar3;
              this_03 = pbVar1;
            }
            bitset::operator|=(this_03,&R);
            bitset::operator-=(this_06,&R);
            if (1 < (this->super_Solver).trace) {
              poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mlevel ");
              poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
              std::operator<<(poVar19,"-R\x1b[m");
              for (sVar17 = bitset::find_last(this_01); poVar19 = (this->super_Solver).logger,
                  sVar17 != 0xffffffffffffffff; sVar17 = bitset::find_prev(this_01,sVar17)) {
                poVar19 = std::operator<<(poVar19," \x1b[38;5;38m");
                SG_1._bits = (uint64_t *)(this->super_Solver).game;
                SG_1._size._0_4_ = (uint)sVar17;
                poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
                std::operator<<(poVar19,"\x1b[m");
              }
              std::endl<char,std::char_traits<char>>(poVar19);
              if (1 < (this->super_Solver).trace) {
                poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mlevel ");
                poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
                std::operator<<(poVar19,"-U\x1b[m");
                for (sVar17 = bitset::find_last(&R); poVar19 = (this->super_Solver).logger,
                    sVar17 != 0xffffffffffffffff; sVar17 = bitset::find_prev(&R,sVar17)) {
                  poVar19 = std::operator<<(poVar19," \x1b[38;5;38m");
                  SG_1._bits = (uint64_t *)(this->super_Solver).game;
                  SG_1._size._0_4_ = (uint)sVar17;
                  poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
                  std::operator<<(poVar19,"\x1b[m");
                }
                std::endl<char,std::char_traits<char>>(poVar19);
              }
            }
            bitset::operator&=(this_02,this_01);
            for (sVar17 = bitset::find_last(this_02); sVar17 != 0xffffffffffffffff;
                sVar17 = bitset::find_prev(this_02,sVar17)) {
              iVar12 = (this->Q).pointer;
              (this->Q).pointer = iVar12 + 1;
              (this->Q).queue[iVar12] = (uint)sVar17;
            }
            while( true ) {
              iVar12 = (this->Q).pointer;
              if ((long)iVar12 == 0) break;
              (this->Q).pointer = iVar12 + -1;
              uVar4 = (this->Q).queue[(long)iVar12 + -1];
              attractVertices(this,uVar15,uVar4,this_02,this_01,this_01);
              attractTangles(this,uVar15,uVar4,this_01,this_02,this_01);
            }
            bitset::operator|=(this_06,this_02);
            bitset::operator-=(this_03,this_02);
            if (1 < (this->super_Solver).trace) {
              poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mlevel ");
              poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
              std::operator<<(poVar19,"-H\x1b[m");
              for (sVar17 = bitset::find_last(this_02); poVar19 = (this->super_Solver).logger,
                  sVar17 != 0xffffffffffffffff; sVar17 = bitset::find_prev(this_02,sVar17)) {
                poVar19 = std::operator<<(poVar19," \x1b[38;5;38m");
                SG_1._bits = (uint64_t *)(this->super_Solver).game;
                SG_1._size._0_4_ = (uint)sVar17;
                poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
                std::operator<<(poVar19,"\x1b[m");
              }
              std::endl<char,std::char_traits<char>>(poVar19);
            }
            bitset::~bitset(&R);
            uVar13 = uVar13 + 1;
          }
        }
      }
LAB_00167a53:
      piVar18 = (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar18) {
        (this->heads).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = piVar18;
      }
      bitset::operator-=(this_04,SG);
      if (1 < (this->super_Solver).trace) {
        poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mpre subgame \x1b[36m");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar26);
        std::operator<<(poVar19,"\x1b[m");
        uVar21 = local_150;
        while (iVar12 = (int)uVar21, -1 < iVar12) {
          uVar27 = uVar21 >> 6 & 0x3ffffff;
          if (((H._bits[uVar27] >> (uVar21 & 0x3f) & 1) != 0) &&
             ((this_05->_bits[uVar27] & 1L << (uVar21 & 0x3f)) == 0)) {
            poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;46m");
            R._size._0_4_ = iVar12;
            R._bits = (uint64_t *)(this->super_Solver).game;
            poVar19 = operator<<(poVar19,(_label_vertex *)&R);
            std::operator<<(poVar19,"\x1b[m");
          }
          uVar21 = (ulong)(iVar12 - 1);
        }
        std::operator<<((this->super_Solver).logger," |");
        uVar21 = local_150;
        while (iVar12 = (int)uVar21, -1 < iVar12) {
          uVar27 = uVar21 >> 6 & 0x3ffffff;
          if (((SG->_bits[uVar27] >> (uVar21 & 0x3f) & 1) != 0) &&
             ((H._bits[uVar27] & 1L << (uVar21 & 0x3f)) == 0)) {
            poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
            R._size._0_4_ = iVar12;
            R._bits = (uint64_t *)(this->super_Solver).game;
            poVar19 = operator<<(poVar19,(_label_vertex *)&R);
            std::operator<<(poVar19,"\x1b[m");
          }
          uVar21 = (ulong)(iVar12 - 1);
        }
        std::operator<<((this->super_Solver).logger," |");
        uVar21 = local_150;
        while (iVar12 = (int)uVar21, -1 < iVar12) {
          uVar27 = uVar21 >> 6 & 0x3ffffff;
          if (((SG->_bits[uVar27] >> (uVar21 & 0x3f) & 1) != 0) &&
             (uVar21 = 1L << (uVar21 & 0x3f), (this_05->_bits[uVar27] & uVar21) != 0)) {
            poVar19 = (this->super_Solver).logger;
            if ((*(ulong *)(*(long *)((long)&(this->W0)._bits + uVar20) + uVar27 * 8) & uVar21) == 0
               ) {
              poVar19 = std::operator<<(poVar19," \x1b[38;5;196m");
              R._size._0_4_ = iVar12;
              R._bits = (uint64_t *)(this->super_Solver).game;
              poVar19 = operator<<(poVar19,(_label_vertex *)&R);
              std::operator<<(poVar19,"\x1b[m");
            }
            else {
              poVar19 = std::operator<<(poVar19," \x1b[38;5;202m");
              R._size._0_4_ = iVar12;
              R._bits = (uint64_t *)(this->super_Solver).game;
              poVar19 = operator<<(poVar19,(_label_vertex *)&R);
              std::operator<<(poVar19,"\x1b[m");
            }
          }
          uVar21 = (ulong)(iVar12 - 1);
        }
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        std::operator<<((this->super_Solver).logger,"\x1b[1;33mgame");
        uVar21 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
        while( true ) {
          uVar21 = uVar21 - 1;
          uVar13 = (uint)uVar21;
          if ((int)uVar13 < 0) break;
          uVar15 = uVar13 >> 6 & 0x1ffffff;
          if ((((this->G)._bits[uVar15] >> (uVar21 & 0x3f) & 1) != 0) &&
             ((pbVar3->_bits[uVar15] & 1L << (uVar21 & 0x3f)) != 0)) {
            poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;202m");
            R._size._0_4_ = uVar13;
            R._bits = (uint64_t *)(this->super_Solver).game;
            poVar19 = operator<<(poVar19,(_label_vertex *)&R);
            std::operator<<(poVar19,"\x1b[m");
          }
        }
        std::operator<<((this->super_Solver).logger," |");
        uVar21 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
        while( true ) {
          uVar21 = uVar21 - 1;
          uVar13 = (uint)uVar21;
          if ((int)uVar13 < 0) break;
          uVar15 = uVar13 >> 6 & 0x1ffffff;
          if ((((this->G)._bits[uVar15] >> (uVar21 & 0x3f) & 1) != 0) &&
             ((pbVar1->_bits[uVar15] & 1L << (uVar21 & 0x3f)) != 0)) {
            poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;201m");
            R._size._0_4_ = uVar13;
            R._bits = (uint64_t *)(this->super_Solver).game;
            poVar19 = operator<<(poVar19,(_label_vertex *)&R);
            std::operator<<(poVar19,"\x1b[m");
          }
        }
        std::operator<<((this->super_Solver).logger," |");
        uVar21 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
        while( true ) {
          uVar21 = uVar21 - 1;
          uVar13 = (uint)uVar21;
          if ((int)uVar13 < 0) break;
          uVar15 = uVar13 >> 6 & 0x1ffffff;
          if (((((this->G)._bits[uVar15] >> (uVar21 & 0x3f) & 1) != 0) &&
              (uVar27 = 1L << (uVar21 & 0x3f), (pbVar3->_bits[uVar15] & uVar27) == 0)) &&
             ((pbVar1->_bits[uVar15] & uVar27) == 0)) {
            poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
            R._size._0_4_ = uVar13;
            R._bits = (uint64_t *)(this->super_Solver).game;
            poVar19 = operator<<(poVar19,(_label_vertex *)&R);
            std::operator<<(poVar19,"\x1b[m");
          }
        }
        std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
      }
      operator^(&R,SG,&H);
      bVar10 = bitset::any(&R);
      iVar12 = (int)local_150;
      if (bVar10) {
        SG_1._bits = (uint64_t *)&R;
        std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
                  ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Rs,(bitset **)&SG_1);
        solve(this,&R,iVar12,pe,po);
        piVar18 = (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppbVar23 = (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish + -1;
        (this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppbVar23;
        if ((ulong)((long)ppbVar23 -
                    (long)(this->Rs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <
            (ulong)((long)piVar18 -
                    (long)(this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2)) {
          (this->Ps).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = piVar18 + -1;
        }
      }
      pppbVar2 = &(this->Hs).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *pppbVar2 = *pppbVar2 + -1;
      bVar10 = bitset::none(SG);
      if (!bVar10) {
        puVar8 = SG->_bits;
        puVar9 = (this->Q).queue;
        for (uVar21 = 0; (long)uVar21 <= (long)iVar12; uVar21 = uVar21 + 1) {
          if (((puVar8[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0) &&
             ((this_05->_bits[uVar21 >> 6] & 1L << (uVar21 & 0x3f)) != 0)) {
            iVar16 = (this->Q).pointer;
            (this->Q).pointer = iVar16 + 1;
            puVar9[iVar16] = (uint)uVar21;
          }
        }
        iVar16 = (this->Q).pointer;
        if (iVar16 == 0) {
          bVar10 = false;
        }
        else {
          bVar10 = false;
          while (iVar16 != 0) {
            (this->Q).pointer = iVar16 + -1;
            uVar4 = (this->Q).queue[(long)iVar16 + -1];
            uVar21 = *(ulong *)(*(long *)((long)&(this->W0)._bits + uVar20) +
                               ((ulong)(long)(int)uVar4 >> 6) * 8);
            attractVertices(this,uVar11 ^ 1,uVar4,this_05,SG,SG);
            attractTangles(this,uVar11 ^ 1,uVar4,SG,this_05,SG);
            bVar10 = (bool)(bVar10 | (uVar21 >> ((long)(int)uVar4 & 0x3fU) & 1) != 0);
            iVar16 = (this->Q).pointer;
          }
        }
        if (1 < (this->super_Solver).trace) {
          poVar19 = std::operator<<((this->super_Solver).logger,"\x1b[1;33mpost subgame \x1b[36m");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,uVar26);
          poVar19 = std::operator<<(poVar19,"\x1b[m (pe=");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,pe);
          poVar19 = std::operator<<(poVar19," po=");
          poVar19 = (ostream *)std::ostream::operator<<(poVar19,po);
          std::operator<<(poVar19,")");
          uVar21 = local_150;
          while (uVar26 = (uint)uVar21, -1 < (int)uVar26) {
            uVar27 = uVar21 >> 6 & 0x3ffffff;
            if (((H._bits[uVar27] >> (uVar21 & 0x3f) & 1) != 0) &&
               ((this_05->_bits[uVar27] & 1L << (uVar21 & 0x3f)) == 0)) {
              poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
              SG_1._bits = (uint64_t *)(this->super_Solver).game;
              SG_1._size._0_4_ = uVar26;
              poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
              std::operator<<(poVar19,"\x1b[m");
            }
            uVar21 = (ulong)(uVar26 - 1);
          }
          std::operator<<((this->super_Solver).logger," |");
          uVar21 = local_150;
          while (uVar26 = (uint)uVar21, -1 < (int)uVar26) {
            uVar27 = uVar21 >> 6 & 0x3ffffff;
            if ((((SG->_bits[uVar27] >> (uVar21 & 0x3f) & 1) != 0) &&
                (uVar21 = 1L << (uVar21 & 0x3f), (H._bits[uVar27] & uVar21) == 0)) &&
               ((this_05->_bits[uVar27] & uVar21) == 0)) {
              poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;46m");
              SG_1._bits = (uint64_t *)(this->super_Solver).game;
              SG_1._size._0_4_ = uVar26;
              poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
              std::operator<<(poVar19,"\x1b[m");
            }
            uVar21 = (ulong)(uVar26 - 1);
          }
          std::operator<<((this->super_Solver).logger," |");
          while (uVar26 = (uint)local_150, -1 < (int)uVar26) {
            uVar21 = local_150 >> 6 & 0x3ffffff;
            if (((SG->_bits[uVar21] >> (local_150 & 0x3f) & 1) != 0) &&
               (uVar27 = 1L << (local_150 & 0x3f), (this_05->_bits[uVar21] & uVar27) != 0)) {
              poVar19 = (this->super_Solver).logger;
              if ((*(ulong *)(*(long *)((long)&(this->W0)._bits + uVar20) + uVar21 * 8) & uVar27) ==
                  0) {
                poVar19 = std::operator<<(poVar19," \x1b[38;5;196m");
                SG_1._bits = (uint64_t *)(this->super_Solver).game;
                SG_1._size._0_4_ = uVar26;
                poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
                std::operator<<(poVar19,"\x1b[m");
              }
              else {
                poVar19 = std::operator<<(poVar19," \x1b[38;5;202m");
                SG_1._bits = (uint64_t *)(this->super_Solver).game;
                SG_1._size._0_4_ = uVar26;
                poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
                std::operator<<(poVar19,"\x1b[m");
              }
            }
            local_150 = (ulong)(uVar26 - 1);
          }
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
          std::operator<<((this->super_Solver).logger,"\x1b[1;33mgame\x1b[m");
          uVar21 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
          while( true ) {
            uVar21 = uVar21 - 1;
            uVar26 = (uint)uVar21;
            if ((int)uVar26 < 0) break;
            uVar13 = uVar26 >> 6 & 0x1ffffff;
            if ((((this->G)._bits[uVar13] >> (uVar21 & 0x3f) & 1) != 0) &&
               ((pbVar3->_bits[uVar13] & 1L << (uVar21 & 0x3f)) != 0)) {
              poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;202m");
              SG_1._bits = (uint64_t *)(this->super_Solver).game;
              SG_1._size._0_4_ = uVar26;
              poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
              std::operator<<(poVar19,"\x1b[m");
            }
          }
          std::operator<<((this->super_Solver).logger," |");
          uVar21 = (ulong)(uint)((this->super_Solver).game)->n_vertices;
          while( true ) {
            uVar21 = uVar21 - 1;
            uVar26 = (uint)uVar21;
            if ((int)uVar26 < 0) break;
            uVar13 = uVar26 >> 6 & 0x1ffffff;
            if ((((this->G)._bits[uVar13] >> (uVar21 & 0x3f) & 1) != 0) &&
               ((pbVar1->_bits[uVar13] & 1L << (uVar21 & 0x3f)) != 0)) {
              poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;201m");
              SG_1._bits = (uint64_t *)(this->super_Solver).game;
              SG_1._size._0_4_ = uVar26;
              poVar19 = operator<<(poVar19,(_label_vertex *)&SG_1);
              std::operator<<(poVar19,"\x1b[m");
            }
          }
          std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
        }
        if (bVar10) {
          bitset::operator-=(this_04,SG);
          bitset::operator-=(SG,this_05);
          bVar10 = bitset::any(SG);
          if (bVar10) {
            solve(this,SG,iVar12,(uint)pe >> uVar11,(uint)po >> ((byte)uVar11 ^ 1));
          }
        }
      }
      bitset::~bitset(&R);
      bitset::~bitset(&H);
      return;
    }
    bitset::operator|=(&this->W1,SG);
    if ((this->super_Solver).trace < 2) {
      return;
    }
    bVar10 = bitset::any(SG);
    if (!bVar10) {
      return;
    }
    std::operator<<((this->super_Solver).logger,"presumed won by player 1:");
    while (iVar12 = (int)local_150, -1 < iVar12) {
      if ((SG->_bits[local_150 >> 6] >> (local_150 & 0x3f) & 1) != 0) {
        poVar19 = std::operator<<((this->super_Solver).logger," \x1b[38;5;38m");
        H._bits = (uint64_t *)(this->super_Solver).game;
        H._size._0_4_ = iVar12;
        poVar19 = operator<<(poVar19,(_label_vertex *)&H);
        std::operator<<(poVar19,"\x1b[m");
      }
      local_150 = (ulong)(iVar12 - 1);
    }
  }
  std::endl<char,std::char_traits<char>>((this->super_Solver).logger);
  return;
}

Assistant:

void
TLQSolver::solve(bitset &SG, int vtop, int pe, int po)
{
    /**
     * This is based on a universal tree of height pr/2, with parameter n associated with pe or po
     */

    iterations++;  // record the number of recursive calls (visits)

    /**
     * If precision is 0 for a player, it means we are only looking for tangles of size <= 0,
     * that is, we presume everything is won by the other player.
     */

    if (po <= 0) {
        W0 |= SG;

#ifndef NDEBUG
        if (trace>=2 and SG.any()) {
            logger << "presumed won by player 0:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        return;
    }

    if (pe <= 0) {
        W1 |= SG;

#ifndef NDEBUG
        if (trace>=2 and SG.any()) {
            logger << "presumed won by player 1:";
            for (int v=vtop; v>=0; v--) {
                if (SG[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        return;
    }

    /**
     * Move <vtop> to the true top (highest vertex that is in SG)
     */

    if (!SG[vtop]) {
        vtop = SG.find_prev(vtop);
        if (((size_t)vtop) == bitset::npos) return;
    }

    /**
     * Obtain the priority and player of the subgame
     */

    if (Ps.size() < Rs.size()) {
        Ps.push_back(priority(vtop));
        // optimisation when we enter this method for the first time!
        auto size = SG.count();
        while ((size_t)(po/2) > size) po/=2;
        while ((size_t)(pe/2) > size) pe/=2;
    }

    const int pr = Ps.back();
    const int pl = pr&1;

    /**
     * Expand the left side of the current level of the universal tree
     */

    if (pl == 0) {
        solve(SG, vtop, pe, po/2);
    } else {
        solve(SG, vtop, pe/2, po);
    }

#ifndef NDEBUG
    if (trace >= 2) logger << "in pr=" << pr << ", pe=" << pe << ", po=" << po << std::endl;
#endif

    auto &Wm = pl == 0 ? W0 : W1; // my W
    auto &Wo = pl == 0 ? W1 : W0; // opponent's W

    /**
     * Update vtop to the highest vertex in the intersection
     */

    if (!SG[vtop]) {
        vtop = SG.find_prev(vtop);
        if (((size_t)vtop) == bitset::npos) return;
    }

    /**
     * Compute H := Attr(vertices of <pr> in <R>)
     */

    bitset H(nodecount());
    Hs.push_back(&H);

    for (int v=vtop; v!=-1; v--) {
        if (!SG[v] || H[v]) continue;
        // if (priority(v) != pr) break; // stop attracting when we reach the next priority
        if ((priority(v)&1) != pl) break; // on-the-fly compression
        heads.push_back(v);
        H[v] = true;
        str[v] = -1;
        Q.push(v);
        while (Q.nonempty()) {
            const int u = Q.pop();
            attractVertices(pl, u, H, SG, SG);
            attractTangles(pl, u, SG, H, SG);
        }
    }

#ifndef NDEBUG
    if (trace) {
        logger << "\033[1;33mregion \033[36m" << pr << "\033[m";
        for (auto v = H.find_last(); v != bitset::npos; v = H.find_prev(v)) {
            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
            if (trace >= 2) {
                if (owner(v) == pl) {
                    if (str[v] == -1) logger << "\033[38;5;37m\033[33m=>\033[38;5;37m-\033[m";
                    else logger << "\033[33m=>\033[38;5;37m =>" << label_vertex(str[v]) << "\033[m";
                }
            }
        }
        logger << std::endl;
    }
#endif

    /**
     * Now check if H has any escapes to R-H
     */

    bool leaky = false;
    for (auto v : heads) {
        if (!attracts(pl, v, H, SG)) {
            leaky = true;
            break;
            // TODO: consider learning tangles from partially leaky regions
        }
    }

    /**
     * If not leaky, then we can learn tangles from H
     */

    if (!leaky) {
        std::fill(pea_vidx, pea_vidx+nodecount(), '\0');
        pea_curidx = 1;
        for (auto v : heads) {
            auto T = tangles, D = dominions;
            extractTangles(v, H);
            if (D != dominions) {
                // maximize the found dominions
                for (auto v = S.find_last(); v != bitset::npos; v = S.find_prev(v)) {
                    Q.push(v);
                }
                while (Q.nonempty()) {
                    const int u = Q.pop();
                    attractVertices(pl, u, S, G, G);
                    attractTangles(pl, u, G, S, G);
                }
                // remove them from the game
                Wm |= S;
                Wo -= S;
                G -= S;
                S.reset();
            }
            if (D != dominions or T != tangles) {
                // now we need to re-maximize all regions
                for (unsigned int k=0; k<Rs.size(); k++) {
                    int k_pr = Ps[k];
                    int k_pl = k_pr & 1;
                    bitset& k_R = *Rs[k];
                    bitset& k_H = *Hs[k];
                    bitset k_U;
                    // first: R[k] - H[k] >= R[k+1]
                    // and compute what remains of k_U
                    if (k == 0) {
                        k_R &= G;
                        k_U = G - k_R;
                    } else {
                        bitset SG = *Rs[k-1] - *Hs[k-1];
                        k_R &= SG;
                        k_U = SG - k_R;
                    }
                    // maximize k_U 
                    for (auto v = k_U.find_last(); v != bitset::npos; v = k_U.find_prev(v)) {
                        Q.push(v);
                    }
                    while (Q.nonempty()) {
                        const int u = Q.pop();
                        attractVertices(1-k_pl, u, k_U, k_R, k_R);
                        attractTangles(1-k_pl, u, k_R, k_U, k_R);
                    }
                    k_R -= k_U;
                    (k_pl == 1 ? W0 : W1) |= k_U;
                    (k_pl == 1 ? W1 : W0) -= k_U;
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-R\033[m";
                        for (auto v = k_R.find_last(); v != bitset::npos; v = k_R.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-U\033[m";
                        for (auto v = k_U.find_last(); v != bitset::npos; v = k_U.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
                    // maximize H
                    k_H &= k_R;
                    for (auto v = k_H.find_last(); v != bitset::npos; v = k_H.find_prev(v)) {
                        Q.push(v);
                    }
                    while (Q.nonempty()) {
                        const int u = Q.pop();
                        attractVertices(k_pl, u, k_H, k_R, k_R);
                        attractTangles(k_pl, u, k_R, k_H, k_R);
                    }
                    (k_pl == 1 ? W1 : W0) |= k_H;
                    (k_pl == 1 ? W0 : W1) -= k_H;
#ifndef NDEBUG
                    if (trace >= 2) {
                        logger << "\033[1;33mlevel " << k << "-H\033[m";
                        for (auto v = k_H.find_last(); v != bitset::npos; v = k_H.find_prev(v)) {
                            logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
                        }
                        logger << std::endl;
                    }
#endif
                }
            }
        }
    }

    heads.clear();

    // Reset Wm for vertices not in SG
    Wm -= SG;

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        // Format: Subgame: [H] | [Mine in subgame] | [Theirs in subgame] | [Earlier removed from SG]
        logger << "\033[1;33mpre subgame \033[36m" << pr << "\033[m";
        for (int v=vtop; v>=0; v--) {
            if (H[v] && !Wo[v]) logger << " \033[38;5;46m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && !H[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && Wo[v]) {
                if (Wm[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // orange -- freshly attracted
                else logger << " \033[38;5;196m" << label_vertex(v) << "\033[m"; // red
            }
        }
        logger << std::endl;
        // Format: Game [player 0] | [player 1] | [no player]
        logger << "\033[1;33mgame";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W0[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m";
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W1[v]) logger << " \033[38;5;201m" << label_vertex(v) << "\033[m"; // green
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && !W0[v] && !W1[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; // blue
        }
        logger << std::endl;
    }
#endif

    /**
     * Go recursive!
     */

    bitset R = SG ^ H;
    if (R.any()) {
        Rs.push_back(&R);
        solve(R, vtop, pe, po);
        Rs.pop_back();
        if (Ps.size() > Rs.size()) Ps.pop_back();
    }
    Hs.pop_back();

    if (SG.none()) return;

    /**
     * Let the opponent attract from our region...
     * The intersection of H and Wo is the opponent's subgame
     */

    bool opponent_attracted_from_us = false;
    for (int v=0; v<=vtop; v++) {
        if (SG[v] and Wo[v]) {
            Q.push(v);
        }
    }
    if (Q.nonempty()) {
        while (Q.nonempty()) {
            const int v = Q.pop();
            if (Wm[v]) opponent_attracted_from_us = true;
            attractVertices(1-pl, v, Wo, SG, SG);
            attractTangles(1-pl, v, SG, Wo, SG);
        }
    }

#ifndef NDEBUG
    /**
     * If so desired, report our current status...
     */
    if (trace >= 2) {
        // Format: Subgame: [H] | [Mine in subgame] | [Theirs in subgame] | [Earlier removed from SG]
        logger << "\033[1;33mpost subgame \033[36m" << pr << "\033[m (pe=" << pe << " po=" << po << ")";
        for (int v=vtop; v>=0; v--) {
            if (H[v] && !Wo[v]) logger << " \033[38;5;38m" << label_vertex(v) << "\033[m"; // blueish
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && !H[v] && !Wo[v]) logger << " \033[38;5;46m" << label_vertex(v) << "\033[m"; // green
        }
        logger << " |";
        for (int v=vtop; v>=0; v--) {
            if (SG[v] && Wo[v]) {
                if (Wm[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // orange -- freshly attracted
                else logger << " \033[38;5;196m" << label_vertex(v) << "\033[m"; // red
            }
        }
        logger << std::endl;
        // Format: Game [player 0] | [player 1] | [no player]
        logger << "\033[1;33mgame\033[m";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W0[v]) logger << " \033[38;5;202m" << label_vertex(v) << "\033[m"; // blueish
        }
        logger << " |";
        for (int v=nodecount()-1; v>=0; v--) {
            if (G[v] && W1[v]) logger << " \033[38;5;201m" << label_vertex(v) << "\033[m"; // green
        }
        logger << std::endl;
    }
#endif

    /**
     * Finally, if the opponent attracted from us, then we do the right side of the universal tree.
     * Also only do this if there is anything remaining in the subgame.
     */

    if (opponent_attracted_from_us) {
        Wm -= SG;  // reset Wm prior to recursion
        SG -= Wo;  // remove opponent won vertices from subgame

        if (SG.any()) {
            // Expand the right side of the current level of the universal tree
            if (pl == 0) solve(SG, vtop, pe, po/2);
            else solve(SG, vtop, pe/2, po);
        }
    }
}